

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_reactor.hpp
# Opt level: O0

size_t __thiscall
asio::detail::epoll_reactor::
cancel_timer<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
          (epoll_reactor *this,
          timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
          *queue,per_timer_data *timer,size_t max_cancelled)

{
  op_queue<asio::detail::scheduler_operation> *this_00;
  scoped_lock<asio::detail::posix_mutex> *in_RDI;
  size_t n;
  op_queue<asio::detail::scheduler_operation> ops;
  scoped_lock lock;
  op_queue<asio::detail::scheduler_operation> *in_stack_ffffffffffffff90;
  posix_mutex *in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa8;
  op_queue<asio::detail::scheduler_operation> *in_stack_ffffffffffffffb0;
  per_timer_data *in_stack_ffffffffffffffb8;
  scheduler *in_stack_ffffffffffffffc0;
  
  scoped_lock<asio::detail::posix_mutex>::scoped_lock(in_RDI,in_stack_ffffffffffffff98);
  op_queue<asio::detail::scheduler_operation>::op_queue(in_stack_ffffffffffffff90);
  this_00 = (op_queue<asio::detail::scheduler_operation> *)
            timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
            ::cancel_timer((timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
                            *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                           in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  scoped_lock<asio::detail::posix_mutex>::unlock
            ((scoped_lock<asio::detail::posix_mutex> *)in_stack_ffffffffffffff90);
  scheduler::post_deferred_completions
            (in_stack_ffffffffffffffc0,
             (op_queue<asio::detail::scheduler_operation> *)in_stack_ffffffffffffffb8);
  op_queue<asio::detail::scheduler_operation>::~op_queue(this_00);
  scoped_lock<asio::detail::posix_mutex>::~scoped_lock
            ((scoped_lock<asio::detail::posix_mutex> *)this_00);
  return (size_t)this_00;
}

Assistant:

std::size_t epoll_reactor::cancel_timer(timer_queue<Time_Traits>& queue,
    typename timer_queue<Time_Traits>::per_timer_data& timer,
    std::size_t max_cancelled)
{
  mutex::scoped_lock lock(mutex_);
  op_queue<operation> ops;
  std::size_t n = queue.cancel_timer(timer, ops, max_cancelled);
  lock.unlock();
  scheduler_.post_deferred_completions(ops);
  return n;
}